

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  Expr *pEVar1;
  ModuleField *pMVar2;
  ModuleField *pMVar3;
  ElemSegmentModuleField *pEVar4;
  bool bVar5;
  Result RVar6;
  TokenType TVar7;
  char *pcVar8;
  pointer *__ptr;
  Enum EVar9;
  _Head_base<0UL,_wabt::Import_*,_false> _Var10;
  ElemExprVector *out_list;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  elem_segment_field;
  Type elem_type;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> table_field;
  Location loc;
  string name;
  ElemExpr elem_expr;
  ModuleFieldList export_fields;
  _Head_base<0UL,_wabt::Import_*,_false> local_158;
  Enum local_14c;
  Enum local_148;
  Type local_144;
  ElemSegmentModuleField *local_140;
  Location local_138;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_110;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_108;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_f0;
  Location local_e8;
  string local_c0;
  ElemExpr local_a0;
  ModuleFieldList local_48;
  
  RVar6 = Expect(this,Lpar);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_a0,this);
  local_e8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       local_a0.var.loc.filename.size_;
  local_e8.field_1._8_8_ = local_a0.var.loc.field_1._0_8_;
  local_e8.filename.data_ = (char *)local_a0._0_8_;
  local_e8.filename.size_ = (size_type)local_a0.var.loc.filename.data_;
  RVar6 = Expect(this,Table);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ParseBindVarOpt(this,&local_c0);
  local_48.size_ = 0;
  local_48.first_ = (ModuleField *)0x0;
  local_48.last_ = (ModuleField *)0x0;
  EVar9 = Error;
  RVar6 = ParseInlineExports(this,&local_48,Table);
  pMVar3 = local_48.first_;
  if (RVar6.enum_ == Error) goto joined_r0x00160bc2;
  bVar5 = PeekMatchLpar(this,Import);
  if (bVar5) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)&local_158,&local_c0);
    RVar6 = ParseInlineImport(this,local_158._M_head_impl);
    _Var10._M_head_impl = local_158._M_head_impl;
    if (((RVar6.enum_ == Error) ||
        (RVar6 = ParseLimits(this,(Limits *)
                                  &(((ElemSegment *)((long)local_158._M_head_impl + 0x40))->
                                   table_var).loc.filename.size_),
        _Var10._M_head_impl = local_158._M_head_impl, RVar6.enum_ == Error)) ||
       (RVar6 = ParseRefType(this,(Type *)&(((ElemSegment *)((long)local_158._M_head_impl + 0x40))->
                                           table_var).type_),
       _Var10._M_head_impl = local_158._M_head_impl, RVar6.enum_ == Error)) {
LAB_00160a74:
      pMVar3 = local_48.first_;
      if ((ElemSegmentModuleField *)_Var10._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
           &((ElemSegmentModuleField *)_Var10._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField)._vptr_ModuleField
          [1])();
        pMVar3 = local_48.first_;
      }
      goto joined_r0x00160bc2;
    }
    GetToken((Token *)&local_a0,this);
    local_138.field_1.field_0.line = (int)local_a0.var.loc.filename.size_;
    local_138.field_1.field_0.first_column = (int)(local_a0.var.loc.filename.size_ >> 0x20);
    local_138.field_1.field_0.last_column = (int)local_a0.var.loc.field_1._0_8_;
    local_138.field_1._12_4_ = (undefined4)((ulong)local_a0.var.loc.field_1._0_8_ >> 0x20);
    local_138.filename.data_ = (char *)local_a0._0_8_;
    local_138.filename.size_._0_4_ = SUB84(local_a0.var.loc.filename.data_,0);
    local_138.filename.size_._4_4_ = (undefined4)((ulong)local_a0.var.loc.filename.data_ >> 0x20);
    local_f0._M_head_impl = (ImportModuleField *)operator_new(0x48);
    _Var10._M_head_impl = local_158._M_head_impl;
    local_158._M_head_impl = (Import *)0x0;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001b01b0;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename.data_ = local_138.filename.data_;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename.size_ =
         CONCAT44(local_138.filename.size_._4_4_,(undefined4)local_138.filename.size_);
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.field_1.field_1.offset =
         CONCAT44(local_138.field_1.field_0.first_column,local_138.field_1.field_0.line);
    *(ulong *)((long)&((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                      super_ModuleField.loc.field_1 + 8) =
         CONCAT44(local_138.field_1._12_4_,local_138.field_1.field_0.last_column);
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    type_ = Import;
    ((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001b0990;
    ((local_f0._M_head_impl)->import)._M_t.
    super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
    super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var10._M_head_impl;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_f0);
    if (local_f0._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_f0._M_head_impl = (ImportModuleField *)0x0;
    _Var10._M_head_impl = local_158._M_head_impl;
LAB_00160b72:
    if ((ElemSegmentModuleField *)_Var10._M_head_impl != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
         &((ElemSegmentModuleField *)_Var10._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField)._vptr_ModuleField[1]
      )();
    }
  }
  else {
    TVar7 = Peek(this,0);
    if (TVar7 != First_Type) {
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_a0,&local_e8,&local_c0);
      RVar6 = ParseLimits(this,(Limits *)
                               ((long)&(((ElemSegment *)(local_a0._0_8_ + 0x40))->name).field_2 + 8)
                         );
      _Var10._M_head_impl = (Import *)local_a0._0_8_;
      if ((RVar6.enum_ == Error) ||
         (RVar6 = ParseRefType(this,(Type *)&(((ElemSegment *)(local_a0._0_8_ + 0x40))->table_var).
                                             loc.field_1.field_0),
         _Var10._M_head_impl = (Import *)local_a0._0_8_, RVar6.enum_ == Error)) goto LAB_00160a74;
      local_110._M_head_impl = (TableModuleField *)local_a0._0_8_;
      local_a0._0_8_ = (ElemSegmentModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_110);
      if (local_110._M_head_impl != (TableModuleField *)0x0) {
        (*((local_110._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_110._M_head_impl = (TableModuleField *)0x0;
      _Var10._M_head_impl = (Import *)local_a0._0_8_;
      goto LAB_00160b72;
    }
    RVar6 = ParseRefType(this,&local_144);
    pMVar3 = local_48.first_;
    if (((RVar6.enum_ == Error) ||
        (RVar6 = Expect(this,Lpar), pMVar3 = local_48.first_, RVar6.enum_ == Error)) ||
       (RVar6 = Expect(this,Elem), pMVar3 = local_48.first_, RVar6.enum_ == Error))
    goto joined_r0x00160bc2;
    MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>((wabt *)&local_158,&local_e8);
    _Var10._M_head_impl = local_158._M_head_impl;
    local_138.field_1.field_0.line = 0;
    local_138.field_1.field_0.first_column = 0;
    local_138.field_1.field_0.last_column = 0;
    local_138.filename.data_ = (char *)0x0;
    local_138.filename.size_._0_4_ = 0;
    local_138.filename.size_._4_4_ = 0;
    Var::Var((Var *)&local_a0,
             (Index)((ulong)((long)(module->tables).
                                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(module->tables).
                                  super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),&local_138);
    Var::operator=(&((ElemSegment *)((long)_Var10._M_head_impl + 0x40))->table_var,(Var *)&local_a0)
    ;
    Var::~Var((Var *)&local_a0);
    local_140 = (ElemSegmentModuleField *)_Var10._M_head_impl;
    local_f8._M_head_impl = (Expr *)operator_new(0x88);
    ((local_f8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    ((local_f8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    ((local_f8._M_head_impl)->loc).filename.data_ = (char *)0x0;
    ((local_f8._M_head_impl)->loc).filename.size_ = 0;
    *(undefined8 *)((long)&((local_f8._M_head_impl)->loc).filename.size_ + 4) = 0;
    *(undefined8 *)((long)&((local_f8._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
    (local_f8._M_head_impl)->type_ = Const;
    (local_f8._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_001b0520;
    local_f8._M_head_impl[1]._vptr_Expr = (_func_int **)0x0;
    local_f8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
    *(undefined8 *)((long)&local_f8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ + 4)
         = 0;
    *(undefined8 *)((long)&local_f8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4)
         = 0;
    *(undefined4 *)&local_f8._M_head_impl[1].loc.filename.size_ = 0xffffffff;
    local_f8._M_head_impl[1].loc.field_1.field_0.line = 0;
    local_f8._M_head_impl[1].type_ = AtomicLoad;
    intrusive_list<wabt::Expr>::push_back
              (&((ElemSegment *)((long)_Var10._M_head_impl + 0x40))->offset,
               (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f8);
    if (local_f8._M_head_impl != (Expr *)0x0) {
      (*(local_f8._M_head_impl)->_vptr_Expr[1])();
    }
    pEVar4 = local_140;
    local_f8._M_head_impl = (Expr *)0x0;
    if ((local_140->elem_segment).offset.size_ == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                    ,0x192,
                    "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                   );
    }
    pEVar1 = (local_140->elem_segment).offset.last_;
    (pEVar1->loc).field_1.field_1.offset = (size_t)local_e8.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar1->loc).field_1 + 8) = local_e8.field_1._8_8_;
    (pEVar1->loc).filename.data_ = local_e8.filename.data_;
    (pEVar1->loc).filename.size_ = local_e8.filename.size_;
    local_148 = local_144.enum_;
    (local_140->elem_segment).elem_type.enum_ = local_144.enum_;
    local_a0._0_8_ = (ulong)(uint)local_a0._4_4_ << 0x20;
    local_138.field_1.field_0.line = 0;
    local_138.field_1.field_0.first_column = 0;
    local_138.field_1.field_0.last_column = 0;
    local_138.filename.data_ = (char *)0x0;
    local_138.filename.size_._0_4_ = 0;
    local_138.filename.size_._4_4_ = 0;
    Var::Var(&local_a0.var,0xffffffff,&local_138);
    local_a0.type.enum_ = FuncRef;
    bVar5 = ParseElemExprOpt(this,&local_a0);
    out_list = &(pEVar4->elem_segment).elem_exprs;
    if (bVar5) {
      std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back(out_list,&local_a0);
      ParseElemExprListOpt(this,out_list);
    }
    else {
      ParseElemExprVarListOpt(this,out_list);
    }
    RVar6 = Expect(this,Rpar);
    if (RVar6.enum_ != Error) {
      local_14c = RVar6.enum_;
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_138,&local_e8,&local_c0);
      pcVar8 = (char *)(((long)(local_140->elem_segment).elem_exprs.
                               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_140->elem_segment).elem_exprs.
                               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
      *(char **)((long)&(((ElemSegment *)((long)local_138.filename.data_ + 0x40))->name).field_2 + 8
                ) = pcVar8;
      (((ElemSegment *)((long)local_138.filename.data_ + 0x40))->table_var).loc.filename.data_ =
           pcVar8;
      *(bool *)&(((ElemSegment *)((long)local_138.filename.data_ + 0x40))->table_var).loc.filename.
                size_ = true;
      (((ElemSegment *)((long)local_138.filename.data_ + 0x40))->table_var).loc.field_1.field_0.line
           = local_148;
      local_100._M_head_impl = (TableModuleField *)local_138.filename.data_;
      local_138.filename.data_ = (char *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_100);
      if (local_100._M_head_impl != (TableModuleField *)0x0) {
        (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_100._M_head_impl = (TableModuleField *)0x0;
      local_108._M_head_impl = (ElemSegmentModuleField *)local_158._M_head_impl;
      local_158._M_head_impl = (Import *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_108);
      if (local_108._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)
           &(local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
      RVar6.enum_ = local_14c;
      local_108._M_head_impl = (ElemSegmentModuleField *)0x0;
      if ((ElemSegmentModuleField *)local_138.filename.data_ != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)local_138.filename.data_)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
    }
    Var::~Var(&local_a0.var);
    if ((ElemSegmentModuleField *)local_158._M_head_impl != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)&(local_158._M_head_impl)->_vptr_Import)->
        super_ModuleField)._vptr_ModuleField[1])();
    }
    pMVar3 = local_48.first_;
    if (RVar6.enum_ == Error) goto joined_r0x00160bc2;
  }
  anon_unknown_1::AppendInlineExportFields
            (module,&local_48,
             (int)((ulong)((long)(module->tables).
                                 super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(module->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar6 = Expect(this,Rpar);
  EVar9 = (Enum)(RVar6.enum_ == Error);
  pMVar3 = local_48.first_;
joined_r0x00160bc2:
  while (pMVar3 != (ModuleField *)0x0) {
    pMVar2 = (pMVar3->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar3->_vptr_ModuleField[1])();
    pMVar3 = pMVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = MakeUnique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size());
    elem_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ElemExpr elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(elem_expr);
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = MakeUnique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = MakeUnique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}